

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::PulseStyleSymbol::checkPreviouslyUsed
          (PulseStyleSymbol *this,TimingPathMap *timingPathMap)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  Scope *this_00;
  SyntaxNode *pSVar3;
  size_t sVar4;
  Expression *this_01;
  group_type_pointer pgVar5;
  ulong uVar6;
  TimingPathSymbol *this_02;
  pointer ppEVar7;
  Expression *this_03;
  uint uVar8;
  undefined1 auVar9 [16];
  pointer ppEVar10;
  Symbol *pSVar11;
  ulong uVar12;
  long lVar13;
  Symbol *pSVar14;
  Diagnostic *this_04;
  ulong uVar15;
  SourceLocation SVar16;
  value_type_pointer ppVar17;
  ulong uVar18;
  pointer ppEVar19;
  uint uVar20;
  SourceLocation SVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  undefined1 auVar26 [16];
  iterator iVar27;
  string_view arg;
  SourceRange range;
  
  this_00 = (this->super_Symbol).parentScope;
  pSVar3 = (this->super_Symbol).originatingSyntax;
  if (this->isResolved == false) {
    resolve(this);
  }
  sVar4 = (this->terminals)._M_extent._M_extent_value;
  if (sVar4 != 0) {
    ppEVar19 = (this->terminals)._M_ptr;
    ppEVar10 = ppEVar19 + sVar4;
    do {
      this_01 = *ppEVar19;
      pSVar11 = Expression::getSymbolReference(this_01,true);
      if (pSVar11 != (Symbol *)0x0) {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = pSVar11;
        uVar15 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar12 = uVar15 >> ((byte)(timingPathMap->table_).
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
                                  .arrays.groups_size_index & 0x3f);
        pgVar5 = (timingPathMap->table_).
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
                 .arrays.groups_;
        uVar2 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar15 & 0xff];
        ppVar17 = (timingPathMap->table_).
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
                  .arrays.elements_;
        uVar6 = (timingPathMap->table_).
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
                .arrays.groups_size_mask;
        uVar18 = 0;
        do {
          pgVar1 = pgVar5 + uVar12;
          uVar22 = (uchar)uVar2;
          auVar26[0] = -(pgVar1->m[0].n == uVar22);
          uVar23 = (uchar)((uint)uVar2 >> 8);
          auVar26[1] = -(pgVar1->m[1].n == uVar23);
          uVar24 = (uchar)((uint)uVar2 >> 0x10);
          auVar26[2] = -(pgVar1->m[2].n == uVar24);
          uVar25 = (uchar)((uint)uVar2 >> 0x18);
          auVar26[3] = -(pgVar1->m[3].n == uVar25);
          auVar26[4] = -(pgVar1->m[4].n == uVar22);
          auVar26[5] = -(pgVar1->m[5].n == uVar23);
          auVar26[6] = -(pgVar1->m[6].n == uVar24);
          auVar26[7] = -(pgVar1->m[7].n == uVar25);
          auVar26[8] = -(pgVar1->m[8].n == uVar22);
          auVar26[9] = -(pgVar1->m[9].n == uVar23);
          auVar26[10] = -(pgVar1->m[10].n == uVar24);
          auVar26[0xb] = -(pgVar1->m[0xb].n == uVar25);
          auVar26[0xc] = -(pgVar1->m[0xc].n == uVar22);
          auVar26[0xd] = -(pgVar1->m[0xd].n == uVar23);
          auVar26[0xe] = -(pgVar1->m[0xe].n == uVar24);
          auVar26[0xf] = -(pgVar1->m[0xf].n == uVar25);
          for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe); uVar20 != 0;
              uVar20 = uVar20 - 1 & uVar20) {
            uVar8 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
              }
            }
            if (pSVar11 == ppVar17[uVar12 * 0xf + (ulong)uVar8].first) {
              ppVar17 = ppVar17 + uVar12 * 0xf + (ulong)uVar8;
              goto LAB_0040c390;
            }
          }
          if ((pgVar5[uVar12].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7]) == 0) break;
          lVar13 = uVar12 + uVar18;
          uVar18 = uVar18 + 1;
          uVar12 = lVar13 + 1U & uVar6;
        } while (uVar18 <= uVar6);
        ppVar17 = (value_type_pointer)0x0;
LAB_0040c390:
        if ((ppVar17 != (value_type_pointer)0x0) &&
           ((ppVar17->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
            .size_ctrl.size != 0)) {
          iVar27 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>
                   ::begin(&(ppVar17->second).table_);
          if (((iVar27.p_)->second).
              super__Vector_base<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              ((iVar27.p_)->second).
              super__Vector_base<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            iVar27 = boost::unordered::detail::foa::
                     table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>
                     ::begin(&(ppVar17->second).table_);
            this_02 = *((iVar27.p_)->second).
                       super__Vector_base<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if (this_02->isResolved == false) {
              TimingPathSymbol::resolve(this_02);
            }
            sVar4 = (this_02->outputs)._M_extent._M_extent_value;
            if (sVar4 == 0) {
              SVar16 = (SourceLocation)0x0;
              SVar21 = (SourceLocation)0x0;
            }
            else {
              ppEVar7 = (this_02->outputs)._M_ptr;
              lVar13 = 0;
              do {
                this_03 = *(Expression **)((long)ppEVar7 + lVar13);
                pSVar14 = Expression::getSymbolReference(this_03,true);
                if (pSVar14 == pSVar11) {
                  SVar16 = (this_03->sourceRange).startLoc;
                  SVar21 = (this_03->sourceRange).endLoc;
                  goto LAB_0040c433;
                }
                lVar13 = lVar13 + 8;
              } while (sVar4 << 3 != lVar13);
              SVar16 = (SourceLocation)0x0;
              SVar21 = (SourceLocation)0x0;
            }
LAB_0040c433:
            this_04 = Scope::addDiag(this_00,(DiagCode)0xf20006,this_01->sourceRange);
            arg = parsing::Token::valueText((Token *)&pSVar3[3].parent);
            Diagnostic::operator<<(this_04,arg);
            Diagnostic::operator<<(this_04,pSVar11->name);
            range.endLoc = SVar21;
            range.startLoc = SVar16;
            Diagnostic::addNote(this_04,(DiagCode)0x50001,range);
          }
        }
      }
      ppEVar19 = ppEVar19 + 1;
    } while (ppEVar19 != ppEVar10);
  }
  return;
}

Assistant:

void PulseStyleSymbol::checkPreviouslyUsed(const TimingPathMap& timingPathMap) const {
    auto parent = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(parent && syntax);

    for (auto terminal : getTerminals()) {
        if (auto symbol = terminal->getSymbolReference()) {
            if (auto it = timingPathMap.find(symbol); it != timingPathMap.end()) {
                if (!it->second.empty() && !it->second.begin()->second.empty()) {
                    SourceRange pathRange;
                    auto first = it->second.begin()->second.front();
                    for (auto outputExpr : first->getOutputs()) {
                        if (outputExpr->getSymbolReference() == symbol) {
                            pathRange = outputExpr->sourceRange;
                            break;
                        }
                    }

                    SLANG_ASSERT(pathRange != SourceRange());

                    auto& diag = parent->addDiag(diag::InvalidPulseStyle, terminal->sourceRange);
                    diag << syntax->as<PulseStyleDeclarationSyntax>().keyword.valueText();
                    diag << symbol->name;
                    diag.addNote(diag::NoteDeclarationHere, pathRange);
                }
            }
        }
    }
}